

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O3

void __thiscall muduo::LogFile::append(LogFile *this,char *logline,int len)

{
  pthread_mutex_t *__mutex;
  MutexLockGuard lock;
  
  __mutex = (pthread_mutex_t *)
            (this->mutex_)._M_t.
            super___uniq_ptr_impl<muduo::MutexLock,_std::default_delete<muduo::MutexLock>_>._M_t.
            super__Tuple_impl<0UL,_muduo::MutexLock_*,_std::default_delete<muduo::MutexLock>_>.
            super__Head_base<0UL,_muduo::MutexLock_*,_false>._M_head_impl;
  if (__mutex != (pthread_mutex_t *)0x0) {
    MutexLock::lock((MutexLock *)&__mutex->__data);
    append_unlocked(this,logline,len);
    *(undefined4 *)((long)__mutex->__size + 0x28) = 0;
    pthread_mutex_unlock(__mutex);
    return;
  }
  append_unlocked(this,logline,len);
  return;
}

Assistant:

void LogFile::append(const char* logline, int len)
{
  if (mutex_)
  {
    MutexLockGuard lock(*mutex_);
    append_unlocked(logline, len);
  }
  else
  {
    append_unlocked(logline, len);
  }
}